

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O1

void __thiscall
Diligent::FixedBlockMemoryAllocator::MemoryPage::MemoryPage
          (MemoryPage *this,FixedBlockMemoryAllocator *OwnerAllocator)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  char (*in_RCX) [13];
  size_t __n;
  string msg;
  string local_40;
  void *__s;
  
  uVar1 = OwnerAllocator->m_NumBlocksInPage;
  this->m_NumFreeBlocks = uVar1;
  *(undefined8 *)&this->m_NumInitializedBlocks = 0;
  *(undefined8 *)((long)&this->m_pPageStart + 4) = 0;
  *(undefined4 *)((long)&this->m_pNextFreeBlock + 4) = 0;
  this->m_pOwnerAllocator = OwnerAllocator;
  __n = (ulong)uVar1 * OwnerAllocator->m_BlockSize;
  if (__n == 0) {
    FormatString<char[26],char[13]>
              (&local_40,(Diligent *)"Debug expression failed:\n",(char (*) [26])"PageSize > 0",
               in_RCX);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"MemoryPage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x35);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  iVar2 = (**OwnerAllocator->m_RawMemoryAllocator->_vptr_IMemoryAllocator)
                    (OwnerAllocator->m_RawMemoryAllocator,__n,"FixedBlockMemoryAllocator page",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
                     ,0x37);
  __s = (void *)CONCAT44(extraout_var,iVar2);
  this->m_pPageStart = __s;
  this->m_pNextFreeBlock = __s;
  memset(__s,0xaa,__n);
  return;
}

Assistant:

FixedBlockMemoryAllocator::MemoryPage::MemoryPage(FixedBlockMemoryAllocator& OwnerAllocator) :
    // clang-format off
    m_NumFreeBlocks       {OwnerAllocator.m_NumBlocksInPage},
    m_NumInitializedBlocks{0},
    m_pOwnerAllocator     {&OwnerAllocator}
// clang-format on
{
    const auto PageSize = OwnerAllocator.m_BlockSize * OwnerAllocator.m_NumBlocksInPage;
    VERIFY_EXPR(PageSize > 0);
    m_pPageStart = reinterpret_cast<Uint8*>(
        OwnerAllocator.m_RawMemoryAllocator.Allocate(PageSize, "FixedBlockMemoryAllocator page", __FILE__, __LINE__));
    m_pNextFreeBlock = m_pPageStart;
    FillWithDebugPattern(m_pPageStart, NewPageMemPattern, PageSize);
}